

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::listTags
          (XmlReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags)

{
  pointer pTVar1;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *psVar2;
  _Base_ptr p_Var3;
  XmlFormatting fmt;
  XmlWriter *this_00;
  allocator<char> local_a1;
  pointer local_a0;
  ScopedElement aliasTag;
  string local_70;
  ScopedElement innerTag;
  ScopedElement outerTag;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"TagsFromMatchingTests",(allocator<char> *)&aliasTag);
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&outerTag,(string *)this_00,(XmlFormatting)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar1 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (local_a0 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>).
                  _M_impl.super__Vector_impl_data._M_start; local_a0 != pTVar1;
      local_a0 = local_a0 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Tag",(allocator<char> *)&aliasTag);
    fmt = (XmlFormatting)&local_70;
    XmlWriter::scopedElement((XmlWriter *)&innerTag,(string *)this_00,fmt);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Count",&local_a1);
    XmlWriter::startElement(this_00,&local_70,Indent);
    std::__cxx11::to_string((string *)&aliasTag,local_a0->count);
    XmlWriter::writeText(this_00,(StringRef)aliasTag,None);
    XmlWriter::endElement(this_00,Newline);
    std::__cxx11::string::~string((string *)&aliasTag);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Aliases",&local_a1);
    XmlWriter::scopedElement((XmlWriter *)&aliasTag,(string *)this_00,fmt);
    std::__cxx11::string::~string((string *)&local_70);
    psVar2 = &local_a0->spellings;
    for (p_Var3 = (local_a0->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Alias",&local_a1);
      XmlWriter::startElement(this_00,&local_70,Indent);
      XmlWriter::writeText(this_00,*(StringRef *)(p_Var3 + 1),None);
      XmlWriter::endElement(this_00,Newline);
      std::__cxx11::string::~string((string *)&local_70);
    }
    XmlWriter::ScopedElement::~ScopedElement(&aliasTag);
    XmlWriter::ScopedElement::~ScopedElement(&innerTag);
  }
  XmlWriter::ScopedElement::~ScopedElement(&outerTag);
  return;
}

Assistant:

void XmlReporter::listTags(std::vector<TagInfo> const& tags) {
        auto outerTag = m_xml.scopedElement("TagsFromMatchingTests");
        for (auto const& tag : tags) {
            auto innerTag = m_xml.scopedElement("Tag");
            m_xml.startElement("Count", XmlFormatting::Indent)
                 .writeText(std::to_string(tag.count), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            auto aliasTag = m_xml.scopedElement("Aliases");
            for (auto const& alias : tag.spellings) {
                m_xml.startElement("Alias", XmlFormatting::Indent)
                     .writeText(alias, XmlFormatting::None)
                     .endElement(XmlFormatting::Newline);
            }
        }
    }